

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_set_decode_area(opj_j2k_v2_t *p_j2k,opj_image_t *p_image,OPJ_INT32 p_start_x,
                            OPJ_INT32 p_start_y,OPJ_INT32 p_end_x,OPJ_INT32 p_end_y,
                            opj_event_mgr *p_manager)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  opj_event_mgr_t *in_stack_00000008;
  OPJ_INT32 l_w;
  OPJ_INT32 l_h;
  opj_image_comp_t *l_img_comp;
  OPJ_INT32 l_comp_y1;
  OPJ_INT32 l_comp_x1;
  OPJ_UINT32 it_comp;
  opj_image_t *l_image;
  opj_cp_v2_t *l_cp;
  int *local_50;
  uint local_3c;
  opj_bool local_4;
  
  puVar1 = *(uint **)(in_RDI + 0x60);
  if (*(int *)(in_RDI + 8) == 8) {
    if ((((in_EDX == 0) && (in_ECX == 0)) && (in_R8D == 0)) && (in_R9D == 0)) {
      opj_event_msg_v2(in_stack_00000008,4,
                       "No decoded area parameters, set the decoded area to the whole image\n");
      *(undefined4 *)(in_RDI + 0x28) = 0;
      *(undefined4 *)(in_RDI + 0x2c) = 0;
      *(undefined4 *)(in_RDI + 0x30) = *(undefined4 *)(in_RDI + 0x90);
      *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x94);
      local_4 = 1;
    }
    else if (puVar1[2] < in_EDX) {
      opj_event_msg_v2(in_stack_00000008,1,
                       "Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n"
                       ,(ulong)in_EDX,(ulong)puVar1[2]);
      local_4 = 0;
    }
    else {
      if (in_EDX < *puVar1) {
        opj_event_msg_v2(in_stack_00000008,2,
                         "Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n"
                         ,(ulong)in_EDX,(ulong)*puVar1);
        *(undefined4 *)(in_RDI + 0x28) = 0;
        *in_RSI = *puVar1;
      }
      else {
        *(uint *)(in_RDI + 0x28) = (in_EDX - *(int *)(in_RDI + 0x74)) / *(uint *)(in_RDI + 0x7c);
        *in_RSI = in_EDX;
      }
      if (puVar1[3] < in_ECX) {
        opj_event_msg_v2(in_stack_00000008,1,
                         "Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n"
                         ,(ulong)in_ECX,(ulong)puVar1[3]);
        local_4 = 0;
      }
      else {
        if (in_ECX < puVar1[1]) {
          opj_event_msg_v2(in_stack_00000008,2,
                           "Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n"
                           ,(ulong)in_ECX,(ulong)puVar1[1]);
          *(undefined4 *)(in_RDI + 0x2c) = 0;
          in_RSI[1] = puVar1[1];
        }
        else {
          *(uint *)(in_RDI + 0x2c) = (in_ECX - *(int *)(in_RDI + 0x78)) / *(uint *)(in_RDI + 0x80);
          in_RSI[1] = in_ECX;
        }
        if (in_R8D < *puVar1) {
          opj_event_msg_v2(in_stack_00000008,1,
                           "Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n"
                           ,(ulong)in_R8D,(ulong)*puVar1);
          local_4 = 0;
        }
        else {
          if (puVar1[2] < in_R8D) {
            opj_event_msg_v2(in_stack_00000008,2,
                             "Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n"
                             ,(ulong)in_R8D,(ulong)puVar1[2]);
            *(undefined4 *)(in_RDI + 0x30) = *(undefined4 *)(in_RDI + 0x90);
            in_RSI[2] = puVar1[2];
          }
          else {
            iVar2 = int_ceildiv(in_R8D - *(int *)(in_RDI + 0x74),*(int *)(in_RDI + 0x7c));
            *(int *)(in_RDI + 0x30) = iVar2;
            in_RSI[2] = in_R8D;
          }
          if (in_R9D < puVar1[1]) {
            opj_event_msg_v2(in_stack_00000008,1,
                             "Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n"
                             ,(ulong)in_R9D,(ulong)puVar1[1]);
            local_4 = 0;
          }
          else {
            if (puVar1[3] < in_R9D) {
              opj_event_msg_v2(in_stack_00000008,2,
                               "Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n"
                               ,(ulong)in_R9D,(ulong)puVar1[3]);
              *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x94);
              in_RSI[3] = puVar1[3];
            }
            else {
              iVar2 = int_ceildiv(in_R9D - *(int *)(in_RDI + 0x78),*(int *)(in_RDI + 0x80));
              *(int *)(in_RDI + 0x34) = iVar2;
              in_RSI[3] = in_R9D;
            }
            *(byte *)(in_RDI + 0x5c) = *(byte *)(in_RDI + 0x5c) & 0xfd | 2;
            local_50 = *(int **)(in_RSI + 6);
            for (local_3c = 0; local_3c < in_RSI[4]; local_3c = local_3c + 1) {
              iVar2 = int_ceildiv(*in_RSI,*local_50);
              local_50[4] = iVar2;
              iVar2 = int_ceildiv(in_RSI[1],local_50[1]);
              local_50[5] = iVar2;
              iVar2 = int_ceildiv(in_RSI[2],*local_50);
              iVar3 = int_ceildiv(in_RSI[3],local_50[1]);
              iVar2 = int_ceildivpow2(iVar2,local_50[10]);
              iVar4 = int_ceildivpow2(local_50[4],local_50[10]);
              uVar5 = iVar2 - iVar4;
              if ((int)uVar5 < 0) {
                opj_event_msg_v2(in_stack_00000008,1,
                                 "Size x of the decoded component image is incorrect (comp[%d].w=%d).\n"
                                 ,(ulong)local_3c,(ulong)uVar5);
                return 0;
              }
              local_50[2] = uVar5;
              iVar2 = int_ceildivpow2(iVar3,local_50[10]);
              iVar3 = int_ceildivpow2(local_50[5],local_50[10]);
              uVar5 = iVar2 - iVar3;
              if ((int)uVar5 < 0) {
                opj_event_msg_v2(in_stack_00000008,1,
                                 "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n"
                                 ,(ulong)local_3c,(ulong)uVar5);
                return 0;
              }
              local_50[3] = uVar5;
              local_50 = local_50 + 0xe;
            }
            opj_event_msg_v2(in_stack_00000008,4,"Setting decoding area to %d,%d,%d,%d\n",
                             (ulong)*in_RSI,(ulong)in_RSI[1],(ulong)in_RSI[2],in_RSI[3]);
            local_4 = 1;
          }
        }
      }
    }
  }
  else {
    opj_event_msg_v2(in_stack_00000008,1,
                     "Need to decode the main header before begin to decode the remaining codestream"
                    );
    local_4 = 0;
  }
  return local_4;
}

Assistant:

opj_bool j2k_set_decode_area(	opj_j2k_v2_t *p_j2k,
								opj_image_t* p_image,
								OPJ_INT32 p_start_x, OPJ_INT32 p_start_y,
								OPJ_INT32 p_end_x, OPJ_INT32 p_end_y,
								struct opj_event_mgr * p_manager )
{
	opj_cp_v2_t * l_cp = &(p_j2k->m_cp);
	opj_image_t * l_image = p_j2k->m_private_image;

	OPJ_UINT32 it_comp;
	OPJ_INT32 l_comp_x1, l_comp_y1;
	opj_image_comp_t* l_img_comp = NULL;

	/* Check if we are read the main header */
	if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT) { /* FIXME J2K_DEC_STATE_TPHSOT)*/
		opj_event_msg_v2(p_manager, EVT_ERROR, "Need to decode the main header before begin to decode the remaining codestream");
		return OPJ_FALSE;
	}

	if ( !p_start_x && !p_start_y && !p_end_x && !p_end_y){
		opj_event_msg_v2(p_manager, EVT_INFO, "No decoded area parameters, set the decoded area to the whole image\n");

		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;

		return OPJ_TRUE;
	}

	/* ----- */
	/* Check if the positions provided by the user are correct */

	/* Left */
	if (p_start_x > l_image->x1 ) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n",
			p_start_x, l_image->x1);
		return OPJ_FALSE;
	}
	else if (p_start_x < l_image->x0){
		opj_event_msg_v2(p_manager, EVT_WARNING,
				"Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n",
				p_start_x, l_image->x0);
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_image->x0 = l_image->x0;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = (p_start_x - l_cp->tx0) / l_cp->tdx;
		p_image->x0 = p_start_x;
	}

	/* Up */
	if (p_start_y > l_image->y1){
		opj_event_msg_v2(p_manager, EVT_ERROR,
				"Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n",
				p_start_y, l_image->y1);
		return OPJ_FALSE;
	}
	else if (p_start_y < l_image->y0){
		opj_event_msg_v2(p_manager, EVT_WARNING,
				"Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n",
				p_start_y, l_image->y0);
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_image->y0 = l_image->y0;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = (p_start_y - l_cp->ty0) / l_cp->tdy;
		p_image->y0 = p_start_y;
	}

	/* Right */
	if (p_end_x < l_image->x0) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n",
			p_end_x, l_image->x0);
		return OPJ_FALSE;
	}
	else if (p_end_x > l_image->x1) {
		opj_event_msg_v2(p_manager, EVT_WARNING,
			"Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n",
			p_end_x, l_image->x1);
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_image->x1 = l_image->x1;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = int_ceildiv((p_end_x - l_cp->tx0), l_cp->tdx);
		p_image->x1 = p_end_x;
	}

	/* Bottom */
	if (p_end_y < l_image->y0) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n",
			p_end_y, l_image->y0);
		return OPJ_FALSE;
	}
	if (p_end_y > l_image->y1){
		opj_event_msg_v2(p_manager, EVT_WARNING,
			"Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n",
			p_end_y, l_image->y1);
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;
		p_image->y1 = l_image->y1;
	}
	else{
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = int_ceildiv((p_end_y - l_cp->ty0), l_cp->tdy);
		p_image->y1 = p_end_y;
	}
	/* ----- */

	p_j2k->m_specific_param.m_decoder.m_discard_tiles = 1;

	l_img_comp = p_image->comps;
	for (it_comp=0; it_comp < p_image->numcomps; ++it_comp)
	{
		OPJ_INT32 l_h,l_w;

		l_img_comp->x0 = int_ceildiv(p_image->x0, l_img_comp->dx);
		l_img_comp->y0 = int_ceildiv(p_image->y0, l_img_comp->dy);
		l_comp_x1 = int_ceildiv(p_image->x1, l_img_comp->dx);
		l_comp_y1 = int_ceildiv(p_image->y1, l_img_comp->dy);

		l_w = int_ceildivpow2(l_comp_x1, l_img_comp->factor)
				- int_ceildivpow2(l_img_comp->x0, l_img_comp->factor);
		if (l_w < 0){
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"Size x of the decoded component image is incorrect (comp[%d].w=%d).\n",
				it_comp, l_w);
			return OPJ_FALSE;
		}
		l_img_comp->w = l_w;

		l_h = int_ceildivpow2(l_comp_y1, l_img_comp->factor)
				- int_ceildivpow2(l_img_comp->y0, l_img_comp->factor);
		if (l_h < 0){
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"Size y of the decoded component image is incorrect (comp[%d].h=%d).\n",
				it_comp, l_h);
			return OPJ_FALSE;
		}
		l_img_comp->h = l_h;

		l_img_comp++;
	}

	opj_event_msg_v2( p_manager, EVT_INFO,"Setting decoding area to %d,%d,%d,%d\n",
			p_image->x0, p_image->y0, p_image->x1, p_image->y1);


	return OPJ_TRUE;
}